

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::init
          (ReadPixelsTest *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  GLenum GVar2;
  RenderContext *renderCtx;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  ostream *poVar5;
  ShaderProgram *this_00;
  GLubyte *pGVar6;
  istream *piVar7;
  TestError *this_01;
  NotSupportedError *this_02;
  char *pcVar8;
  long lVar9;
  string outtype;
  string extension;
  stringstream fragmentShaderSource;
  long *local_2e8;
  char *local_2e0;
  long local_2d8 [2];
  value_type local_2c8;
  value_type local_2a8;
  undefined1 local_288 [17];
  undefined7 uStack_277;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [32];
  istringstream local_1b8 [16];
  ostream local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER) {
    GVar2 = this->m_renderbufferFormat;
    if ((int)GVar2 < 0x8814) {
      if (GVar2 == 0x822f) {
LAB_0055fbbb:
        pGVar6 = glwGetString(0x1f03);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_288,(char *)pGVar6,(allocator<char> *)&local_2e8);
        std::__cxx11::istringstream::istringstream(local_1b8,(string *)local_288,_S_in);
        if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,CONCAT71(uStack_277,local_288[0x10]) + 1);
        }
        local_288._8_8_ = (pointer)0x0;
        local_288[0x10] = 0;
        local_288._0_8_ = (pointer)(local_288 + 0x10);
        do {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1b8,(string *)local_288,' ');
          uVar3 = *(uint *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18) + 0x20);
          if (((uVar3 & 5) != 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)local_288), iVar4 == 0)) break;
          iVar4 = std::__cxx11::string::compare((char *)local_288);
        } while (iVar4 != 0);
        if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
LAB_0055f920:
          operator_delete((void *)local_288._0_8_,CONCAT71(uStack_277,local_288[0x10]) + 1);
        }
        goto LAB_0055f92d;
      }
      if (GVar2 == 0x8230) goto LAB_0055f876;
    }
    else if ((GVar2 == 0x8814) || (GVar2 == 0x8c3a)) {
LAB_0055f876:
      pGVar6 = glwGetString(0x1f03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,(char *)pGVar6,(allocator<char> *)&local_2e8);
      std::__cxx11::istringstream::istringstream(local_1b8,(string *)local_288,_S_in);
      pbVar1 = (pointer)(local_288 + 0x10);
      if ((pointer)local_288._0_8_ != pbVar1) {
        operator_delete((void *)local_288._0_8_,CONCAT71(uStack_277,local_288[0x10]) + 1);
      }
      local_288._8_8_ = (pointer)0x0;
      local_288[0x10] = 0;
      local_288._0_8_ = pbVar1;
      do {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b8,(string *)local_288,' ');
        uVar3 = *(uint *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18) + 0x20);
        if ((uVar3 & 5) != 0) break;
        iVar4 = std::__cxx11::string::compare((char *)local_288);
      } while (iVar4 != 0);
      if ((pointer)local_288._0_8_ != pbVar1) goto LAB_0055f920;
LAB_0055f92d:
      std::__cxx11::istringstream::~istringstream(local_1b8);
      std::ios_base::~ios_base(local_140);
      if ((uVar3 & 5) != 0) {
        this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_02,"Renderbuffer format not supported","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                   ,0xcb);
        __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    else if (GVar2 == 0x881a) goto LAB_0055fbbb;
  }
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8);
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_NATIVE) {
    pcVar8 = "vec4";
  }
  else {
    if ((this->m_framebuffeType != FRAMEBUFFERTYPE_RENDERBUFFER) ||
       (uVar3 = this->m_texChannelClass - TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT, 3 < uVar3))
    goto LAB_0055f9c7;
    pcVar8 = &DAT_00af1b0c + *(int *)(&DAT_00af1b0c + (ulong)uVar3 * 4);
  }
  std::__cxx11::string::_M_replace((ulong)&local_2e8,0,local_2e0,(ulong)pcVar8);
LAB_0055f9c7:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"#version 300 es\nin mediump vec4 v_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"layout (location = 0) out mediump ",0x22);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_2e8,(long)local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," o_color;\nvoid main(void)\n{\n\to_color = ",0x27);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_2e8,(long)local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(v_color);\n}",0xc);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "#version 300 es\nin mediump vec3 a_position;\nin mediump vec4 a_color;\nuniform mediump float u_colorScale;\nout mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = u_colorScale * a_color;\n}"
             ,"");
  std::__cxx11::stringbuf::str();
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288,&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_270,&local_2a8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_288);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk == false) {
    glu::operator<<(this->m_log,this->m_program);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
               ,0x10c);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  iVar4 = std::ios_base::~ios_base(local_138);
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void ReadPixelsTest::init (void)
{
	// Check extensions
	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		bool supported = false;

		if (m_renderbufferFormat == GL_RGBA16F
			|| m_renderbufferFormat == GL_RG16F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_half_float")
				{
					supported = true;
					break;
				}
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else if (m_renderbufferFormat == GL_RGBA32F
				|| m_renderbufferFormat == GL_RG32F
				|| m_renderbufferFormat == GL_R11F_G11F_B10F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else
			supported = true;

		if (!supported)
			throw tcu::NotSupportedError("Renderbuffer format not supported", "", __FILE__, __LINE__);
	}

	std::string outtype = "";

	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
		outtype = "vec4";
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				outtype = "vec4";
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				outtype = "ivec4";
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				outtype = "uvec4";
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				outtype = "vec4";
				break;

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);


	const char* vertexShaderSource =
	"#version 300 es\n"
	"in mediump vec3 a_position;\n"
	"in mediump vec4 a_color;\n"
	"uniform mediump float u_colorScale;\n"
	"out mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_Position = vec4(a_position, 1.0);\n"
	"\tv_color = u_colorScale * a_color;\n"
	"}";

	stringstream fragmentShaderSource;

	fragmentShaderSource <<
	"#version 300 es\n"
	"in mediump vec4 v_color;\n";


	fragmentShaderSource << "layout (location = 0) out mediump " << outtype << " o_color;\n"
	"void main(void)\n"
	"{\n"
	"\to_color = " << outtype << "(v_color);\n"
	"}";

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource.str()));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to compile shader");
	}
}